

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNCodeBody * __thiscall
CTcParser::parse_code_body
          (CTcParser *this,int eq_before_brace,int is_obj_prop,int self_valid,int *p_argc,
          int *p_opt_argc,int *p_varargs,int *p_varargs_list,CTcSymLocal **p_varargs_list_local,
          int *p_has_retval,int *err,CTcPrsSymtab *local_symtab,tcprs_codebodytype cb_type,
          propset_def *propset_stack,int propset_depth,CTcCodeBodyRef *enclosing_code_body,
          CTcFormalTypeList **type_list)

{
  tc_toktyp_t tVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  CTcCodeBodyRef *this_00;
  CTcPrsSymtab *pCVar5;
  CTcPrsSymtab *pCVar6;
  CTPNCodeBody *cb;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_ECX;
  int in_EDX;
  int *unaff_RBX;
  int unaff_EBP;
  int in_ESI;
  CTcParser *in_RDI;
  tctok_incpath_t *in_R8;
  tctok_incfile_t *in_R9;
  CTcTokStream *unaff_R14;
  CTcTokFileDesc *unaff_R15;
  bool bVar8;
  int unaff_retaddr;
  CTcFormalTypeList **in_stack_00000008;
  undefined4 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  uint *in_stack_00000020;
  CTcTokenizer *in_stack_00000028;
  CTcParser *in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000048;
  CTcPrsSymtab *in_stack_00000050;
  CTPNCodeBody *body_stm;
  unsigned_long flow_flags;
  CTPNStm *ret_stm;
  CTcPrsNode *subexpr_1;
  CTcPrsNode *subexpr;
  CTcSymLocal *lcl;
  CTcPrsNode *expr;
  CTcTokFileDesc *start_desc;
  long start_line;
  CTPNStmComp *stm;
  CTcSymLocal *varargs_list_local;
  int varargs_list;
  int varargs;
  int opt_formal_num;
  int formal_num;
  int parsing_anon_fn;
  CTcPrsMem *in_stack_fffffffffffffe48;
  CTcPrsNode *expr_00;
  CTcTokenizer *in_stack_fffffffffffffe50;
  CTcTokenizer *this_01;
  CTcTokenizer *in_stack_fffffffffffffe58;
  CTcTokenizer *this_02;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar9;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe78;
  CTPNStm *in_stack_fffffffffffffe80;
  CTcPrsSymtab *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  tc_toktyp_t in_stack_fffffffffffffe9c;
  CTcParser *in_stack_fffffffffffffea0;
  CTcParser *in_stack_fffffffffffffea8;
  int varargs_00;
  CTPNStmSwitch *in_stack_fffffffffffffec0;
  int varargs_list_00;
  CTPNStmSwitch *in_stack_fffffffffffffec8;
  CTPNStmSwitch *in_stack_fffffffffffffed0;
  CTPNStmSwitch *in_stack_fffffffffffffed8;
  int self_valid_00;
  CTcPrsSymtab *in_stack_fffffffffffffee0;
  CTPNStmSwitch *local_90;
  CTcTokFileDesc *local_88;
  long local_80;
  CTcPrsSymtab *local_78;
  undefined4 local_70;
  newline_spacing_mode_t nStack_6c;
  undefined4 local_64;
  undefined4 local_60;
  int local_5c;
  int local_58;
  uint local_54;
  undefined4 in_stack_ffffffffffffffc0;
  CTPNCodeBody *local_28;
  CTcParser *pCVar7;
  
  pCVar7 = in_RDI;
  this_00 = (CTcCodeBodyRef *)
            operator_new((size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  iVar4 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  CTcCodeBodyRef::CTcCodeBodyRef(this_00);
  in_RDI->cur_code_body_ = this_00;
  local_54 = (uint)(in_stack_00000038 == 1 || in_stack_00000038 == 3);
  in_RDI->self_valid_ = in_ECX;
  clear_local_ctx(in_RDI);
  if (in_stack_00000030 == (CTcParser *)0x0) {
    in_stack_00000030 = (CTcParser *)in_RDI->global_symtab_;
  }
  in_RDI->local_symtab_ = (CTcPrsSymtab *)in_stack_00000030;
  pCVar5 = CTcPrsSymtab::get_parent(in_RDI->local_symtab_);
  if (pCVar5 == (CTcPrsSymtab *)0x0) {
    pCVar5 = in_RDI->global_symtab_;
  }
  else {
    pCVar5 = CTcPrsSymtab::get_parent(in_RDI->local_symtab_);
  }
  varargs_list_00 = (int)in_stack_fffffffffffffec8;
  varargs_00 = (int)in_stack_fffffffffffffec0;
  in_RDI->enclosing_local_symtab_ = pCVar5;
  in_RDI->enclosing_stm_ = (CTPNStmEnclosing *)0x0;
  in_RDI->goto_symtab_ = (CTcPrsSymtab *)0x0;
  in_RDI->local_cnt_ = 0;
  in_RDI->max_local_cnt_ = 0;
  local_58 = 0;
  local_5c = 0;
  local_60 = 0;
  local_64 = 0;
  local_70 = 0;
  nStack_6c = NEWLINE_SPACING_DELETE;
  local_78 = (CTcPrsSymtab *)0x0;
  local_80 = 0;
  local_88 = (CTcTokFileDesc *)0x0;
  if (in_stack_00000038 != 3) {
    if (in_stack_00000048 != 0) {
      insert_propset_expansion
                (in_stack_fffffffffffffea0,
                 (propset_def *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2ba0e5);
    if (tVar1 == TOKT_LPAR) {
      CTcTokenizer::next(in_stack_fffffffffffffe58);
      iVar4 = (int)((ulong)&stack0xffffffffffffff9c >> 0x20);
      in_stack_fffffffffffffe50 = (CTcTokenizer *)&stack0xffffffffffffff90;
      in_stack_fffffffffffffe60 = 0;
      in_stack_fffffffffffffe58 = in_stack_00000028;
      parse_formal_list(pCVar7,in_ESI,in_EDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),
                        (int *)in_R8,(int *)in_R9,unaff_RBX,(CTcSymLocal **)unaff_R14,
                        &unaff_R15->index_,unaff_EBP,unaff_retaddr,in_stack_00000008);
      if (*(int *)in_stack_00000028 != 0) {
        return (CTPNCodeBody *)0x0;
      }
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2ba19b);
    if (tVar1 == TOKT_EQ) {
      if ((in_ESI == 0) || (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2ba1b9), tVar1 != TOKT_EQ))
      {
        if (in_EDX != 0) {
          CTcTokenizer::log_error(0x2b20);
          CTcTokenizer::next(in_stack_fffffffffffffe58);
        }
      }
      else {
        CTcTokenizer::next(in_stack_fffffffffffffe58);
      }
    }
    in_stack_fffffffffffffe9c = CTcTokenizer::cur((CTcTokenizer *)0x2ba20b);
    if (in_stack_fffffffffffffe9c != TOKT_LBRACE) {
      if ((in_stack_fffffffffffffe9c == TOKT_RBRACE) || (in_stack_fffffffffffffe9c == TOKT_SEM)) {
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe50,iVar4);
        self_valid_00 = (int)in_stack_fffffffffffffee0;
        iVar4 = (int)in_stack_fffffffffffffed8;
        in_stack_fffffffffffffe90 = (CTcPrsSymtab *)CTcPrsAllocObj::operator_new(0x2ba2a3);
        CTPNStmComp::CTPNStmComp
                  ((CTPNStmComp *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (CTPNStm *)in_stack_fffffffffffffe58,(CTcPrsSymtab *)in_stack_fffffffffffffe50);
        local_78 = in_stack_fffffffffffffe90;
        goto LAB_002ba30e;
      }
      CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe50,iVar4);
    }
    CTcTokenizer::get_last_pos(G_tok,&local_88,&local_80);
    local_78 = (CTcPrsSymtab *)
               parse_compound(in_stack_00000030,(int *)pCVar5,
                              (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                              (int)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                              (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    self_valid_00 = (int)in_stack_fffffffffffffee0;
    iVar4 = (int)in_stack_fffffffffffffed8;
    goto LAB_002ba30e;
  }
  CTcTokenizer::get_last_pos(G_tok,&local_88,&local_80);
  expr_00 = (CTcPrsNode *)&stack0xffffffffffffff9c;
  this_01 = (CTcTokenizer *)&stack0xffffffffffffff90;
  uVar9 = 0;
  this_02 = in_stack_00000028;
  parse_formal_list(pCVar7,in_ESI,in_EDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),
                    (int *)in_R8,(int *)in_R9,unaff_RBX,(CTcSymLocal **)unaff_R14,&unaff_R15->index_
                    ,unaff_EBP,unaff_retaddr,in_stack_00000008);
  if (*(int *)in_stack_00000028 != 0) {
    return (CTPNCodeBody *)0x0;
  }
  local_90 = (CTPNStmSwitch *)0x0;
  while( true ) {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2b9c1f);
    self_valid_00 = (int)in_stack_fffffffffffffee0;
    iVar4 = (int)in_stack_fffffffffffffed8;
    if (tVar1 != TOKT_LOCAL) break;
    tVar1 = CTcTokenizer::next(this_02);
    if (tVar1 == TOKT_SYM) {
      in_stack_fffffffffffffee0 = in_RDI->local_symtab_;
      alloc_local(in_RDI);
      CTcPrsSymtab::add_local
                ((CTcPrsSymtab *)CONCAT44(in_stack_fffffffffffffe64,uVar9),
                 (int)((ulong)this_02 >> 0x20));
      tVar1 = CTcTokenizer::next(this_02);
      if (((tVar1 == TOKT_ASI) ||
          (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2b9ca2), tVar1 == TOKT_EQ)) &&
         (in_stack_fffffffffffffed8 =
               (CTPNStmSwitch *)
               parse_local_initializer
                         (in_stack_fffffffffffffea8,(CTcSymLocal *)in_stack_fffffffffffffea0,
                          (int *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
         bVar8 = local_90 != (CTPNStmSwitch *)0x0, local_90 = in_stack_fffffffffffffed8, bVar8)) {
        in_stack_fffffffffffffed0 = (CTPNStmSwitch *)CTcPrsAllocObj::operator_new(0x2b9d02);
        CTPNComma::CTPNComma
                  ((CTPNComma *)CONCAT44(in_stack_fffffffffffffe64,uVar9),(CTcPrsNode *)this_02,
                   (CTcPrsNode *)this_01);
        in_stack_fffffffffffffed8 = in_stack_fffffffffffffed0;
        local_90 = in_stack_fffffffffffffed0;
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2b9da1);
      if (tVar1 == TOKT_COMMA) {
        CTcTokenizer::next(this_02);
      }
    }
    else {
      CTcTokenizer::log_error_curtok(this_01,(int)((ulong)expr_00 >> 0x20));
    }
  }
  if (local_90 == (CTPNStmSwitch *)0x0) {
LAB_002b9df3:
    in_stack_fffffffffffffec8 =
         (CTPNStmSwitch *)parse_expr_or_dstr((CTcParser *)this_01,(int)((ulong)expr_00 >> 0x20));
    if (local_90 != (CTPNStmSwitch *)0x0) {
      in_stack_fffffffffffffec0 = (CTPNStmSwitch *)CTcPrsAllocObj::operator_new(0x2b9e3f);
      CTPNComma::CTPNComma
                ((CTPNComma *)CONCAT44(in_stack_fffffffffffffe64,uVar9),(CTcPrsNode *)this_02,
                 (CTcPrsNode *)this_01);
      in_stack_fffffffffffffec8 = in_stack_fffffffffffffec0;
    }
    varargs_00 = (int)in_stack_fffffffffffffec0;
    local_90 = in_stack_fffffffffffffec8;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2b9dea);
    varargs_00 = (int)in_stack_fffffffffffffec0;
    if (tVar1 != TOKT_RBRACE) goto LAB_002b9df3;
  }
  varargs_list_00 = (int)in_stack_fffffffffffffec8;
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2b9ed8);
  if (tVar1 == TOKT_SEM) {
    CTcTokenizer::log_error(0x2ba1);
    CTcTokenizer::next(this_02);
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2b9f07);
  iVar2 = (int)((ulong)expr_00 >> 0x20);
  if (tVar1 == TOKT_EOF) {
    CTcTokenizer::log_error_curtok(this_01,iVar2);
    *(int *)in_stack_00000028 = 1;
    return (CTPNCodeBody *)0x0;
  }
  if (tVar1 == TOKT_RBRACE) {
    CTcTokenizer::next(this_02);
  }
  else {
    CTcTokenizer::log_error_curtok(this_01,iVar2);
  }
  iVar2 = (*(((CTcSymLocalBase *)&local_90->super_CTPNStmSwitchBase)->super_CTcSymbol).
            super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[10])();
  if (iVar2 == 0) {
    CTcPrsAllocObj::operator_new(0x2b9ff2);
    CTPNStmExpr::CTPNStmExpr((CTPNStmExpr *)this_01,expr_00);
  }
  else {
    CTcPrsAllocObj::operator_new(0x2b9f94);
    CTPNStmReturn::CTPNStmReturn((CTPNStmReturn *)this_01,expr_00);
  }
  pCVar6 = (CTcPrsSymtab *)CTcPrsAllocObj::operator_new(0x2ba04d);
  CTPNStmComp::CTPNStmComp
            ((CTPNStmComp *)CONCAT44(in_stack_fffffffffffffe64,uVar9),(CTPNStm *)this_02,
             (CTcPrsSymtab *)this_01);
  local_78 = pCVar6;
LAB_002ba30e:
  if ((*(int *)in_stack_00000028 == 0) && (local_78 != (CTcPrsSymtab *)0x0)) {
    uVar3 = (*(((CTPNStmCompBase *)&local_78->_vptr_CTcPrsSymtab)->super_CTPNStm).super_CTPNStmBase.
              super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1c])(local_78,1);
    iVar2 = get_syntax_only(G_prs);
    if (iVar2 == 0) {
      if (((uVar3 & 8) == 0) || ((uVar3 & 4) == 0)) {
        if (((uVar3 & 8) != 0) && ((uVar3 & 1) != 0)) {
          CTPNStmBase::log_warning((CTPNStmBase *)local_78,0x2b30);
        }
      }
      else {
        CTPNStmBase::log_warning((CTPNStmBase *)local_78,0x2b2f);
      }
    }
    if (in_R8 != (tctok_incpath_t *)0x0) {
      *(int *)&in_R8->nxt = local_58;
    }
    if (in_R9 != (tctok_incfile_t *)0x0) {
      *(int *)&in_R9->nxt = local_5c;
    }
    if (in_stack_00000008 != (CTcFormalTypeList **)0x0) {
      *(undefined4 *)in_stack_00000008 = local_60;
    }
    if (in_stack_00000010 != (undefined4 *)0x0) {
      *in_stack_00000010 = local_64;
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      *in_stack_00000018 = _local_70;
    }
    if (in_stack_00000020 != (uint *)0x0) {
      *in_stack_00000020 = (uint)((uVar3 & 8) != 0);
    }
    cb = (CTPNCodeBody *)CTcPrsAllocObj::operator_new(0x2ba4a4);
    iVar2 = in_ECX;
    CTPNCodeBody::CTPNCodeBody
              ((CTPNCodeBody *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90,(CTcPrsSymtab *)cb,in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78,
               varargs_00,varargs_list_00,(CTcSymLocal *)in_stack_fffffffffffffed0,iVar4,
               self_valid_00,(CTcCodeBodyRef *)pCVar5);
    in_RDI->cur_code_body_->ptr = cb;
    CTPNCodeBodyBase::set_start_location(&cb->super_CTPNCodeBodyBase,local_88,local_80);
    local_28 = cb;
    iVar4 = (*local_78->_vptr_CTcPrsSymtab[0x1a])();
    pCVar7 = (CTcParser *)CONCAT44(extraout_var,iVar4);
    iVar4 = (*local_78->_vptr_CTcPrsSymtab[0x1b])();
    CTPNCodeBodyBase::set_end_location
              (&cb->super_CTPNCodeBodyBase,(CTcTokFileDesc *)pCVar7,CONCAT44(extraout_var_00,iVar4))
    ;
    finish_local_ctx(pCVar7,cb,in_stack_00000050);
    if (((iVar2 != 0) && (local_54 != 0)) &&
       ((in_RDI->self_referenced_ != 0 || (in_RDI->full_method_ctx_referenced_ != 0)))) {
      CTPNCodeBodyBase::get_or_add_ctx_var_for_level
                ((CTPNCodeBodyBase *)CONCAT44(in_stack_fffffffffffffe6c,in_ECX),
                 in_stack_fffffffffffffe64);
    }
    CTPNCodeBodyBase::set_self_referenced
              (&local_28->super_CTPNCodeBodyBase,in_RDI->self_referenced_);
    CTPNCodeBodyBase::set_full_method_ctx_referenced
              (&local_28->super_CTPNCodeBodyBase,in_RDI->full_method_ctx_referenced_);
    CTPNCodeBodyBase::set_local_ctx_needs_self
              (&local_28->super_CTPNCodeBodyBase,in_RDI->local_ctx_needs_self_);
    CTPNCodeBodyBase::set_local_ctx_needs_full_method_ctx
              (&local_28->super_CTPNCodeBodyBase,in_RDI->local_ctx_needs_full_method_ctx_);
  }
  else {
    local_28 = (CTPNCodeBody *)0x0;
  }
  return local_28;
}

Assistant:

CTPNCodeBody *CTcParser::parse_code_body(
    int eq_before_brace, int is_obj_prop, int self_valid,
    int *p_argc, int *p_opt_argc, int *p_varargs, int *p_varargs_list,
    CTcSymLocal **p_varargs_list_local, int *p_has_retval,
    int *err, CTcPrsSymtab *local_symtab, tcprs_codebodytype cb_type,
    struct propset_def *propset_stack, int propset_depth,
    CTcCodeBodyRef *enclosing_code_body, CTcFormalTypeList **type_list)
{
    /* 
     *   create a new code body reference - this will let nested code bodies
     *   refer back to the code body object we're about to parse, even though
     *   we won't create the actual code body object until we're done parsing
     *   the entire code body 
     */
    cur_code_body_ = new (G_prsmem) CTcCodeBodyRef();

    /* note if we're parsing some kind of anonymous function */
    int parsing_anon_fn = (cb_type == TCPRS_CB_ANON_FN
                           || cb_type == TCPRS_CB_SHORT_ANON_FN);

    /* remember the 'self' validity */
    self_valid_ = self_valid;

    /* presume we will not need a local variable context object */
    clear_local_ctx();

    /* 
     *   Set the outer local symbol table.  If the caller has provided us
     *   with an explicit pre-constructed local symbol table, use that;
     *   otherwise, use the global symbol table, since we have no locals
     *   of our own yet.  
     */
    local_symtab_ = (local_symtab == 0 ? global_symtab_ : local_symtab);
    enclosing_local_symtab_ = (local_symtab_->get_parent() == 0
                               ? global_symtab_
                               : local_symtab_->get_parent());

    /* there's no enclosing statement yet */
    enclosing_stm_ = 0;

    /* 
     *   defer creating a 'goto' symbol table until we encounter a label
     *   or a 'goto' 
     */
    goto_symtab_ = 0;

    /* no locals yet */
    local_cnt_ = 0;
    max_local_cnt_ = 0;

    /* no formals yet */
    int formal_num = 0;
    int opt_formal_num = 0;
    int varargs = FALSE;
    int varargs_list = FALSE;
    CTcSymLocal *varargs_list_local = 0;

    /* we haven't built our statement yet */
    CTPNStmComp *stm = 0;
    long start_line = 0;
    CTcTokFileDesc *start_desc = 0;

    /* check for a short anonymous function, which uses unusual syntax */
    if (cb_type == TCPRS_CB_SHORT_ANON_FN)
    {
        /* we're at the opening brace now */
        G_tok->get_last_pos(&start_desc, &start_line);
        
        /* 
         *   a short-form anonymous function always has an argument list,
         *   but it uses special notation: the argument list is simply the
         *   first thing after the function's open brace, and ends with a
         *   colon 
         */
        parse_formal_list(FALSE, TRUE, &formal_num, &opt_formal_num,
                          &varargs, &varargs_list, &varargs_list_local,
                          err, 0, TRUE, 0);
        if (*err)
            return 0;

        /*
         *   The contents of a short-form anonymous function are simply an
         *   expression, whose value is implicitly returned by the function.
         *   Alternatively, it can start with a list of "local" clauses, to
         *   define local variables.  
         */
        CTcPrsNode *expr = 0;
        while (G_tok->cur() == TOKT_LOCAL)
        {
            /* we need a variable name symbol */
            if (G_tok->next() == TOKT_SYM)
            {
                /* add the symbol */
                CTcSymLocal *lcl = local_symtab_->add_local(alloc_local());

                /* check for an initializer */
                CTcPrsNode *subexpr = 0;
                if (G_tok->next() == TOKT_ASI || G_tok->cur() == TOKT_EQ)
                {
                    /* parse the initializer */
                    subexpr = parse_local_initializer(lcl, err);

                    /* combine it with the expression we had so far */
                    expr = (expr == 0 ? subexpr :
                            new CTPNComma(expr, subexpr));
                }

                /* if there's a comma, skip it */
                if (G_tok->cur() == TOKT_COMMA)
                    G_tok->next();
            }
            else
            {
                /* invalid 'local' syntax */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
            }
        }

        /* if there's anything left, parse the simple expression */
        if (expr == 0 || G_tok->cur() != TOKT_RBRACE)
        {
            /* parse the rest of the expression */
            CTcPrsNode *subexpr = parse_expr_or_dstr(TRUE);

            /* combine it with the local initializers, if any */
            expr = (expr == 0 ? subexpr : new CTPNComma(expr, subexpr));
        }

        /*
         *   The next token must be the closing brace ('}') of the function.
         *   If the next token is a semicolon, it's an error, but it's
         *   probably just a superfluous semicolon that we can ignore.  
         */
        if (G_tok->cur() == TOKT_SEM)
        {
            /* log an error explaining the problem */
            G_tok->log_error(TCERR_SEM_IN_SHORT_ANON_FN);

            /* skip the semicolon */
            G_tok->next();
        }

        /* check for the brace */
        switch (G_tok->cur())
        {
        case TOKT_RBRACE:
            /* this is what we want - skip it and continue */
            G_tok->next();
            break;

        case TOKT_EOF:
            /* log an error and give up */
            G_tok->log_error_curtok(TCERR_SHORT_ANON_FN_REQ_RBRACE);
            *err = 1;
            return 0;

        default:
            /* log an error, assuming they simply forgot the '}' */
            G_tok->log_error_curtok(TCERR_SHORT_ANON_FN_REQ_RBRACE);
            break;
        }

        /* 
         *   This anonymous function syntax implicitly returns the value of
         *   the expression, so generate a 'return' statement node that
         *   returns the expression.  If the expression has no return value,
         *   we're simply evaluating it for side-effects, so wrap it in a
         *   simple 'expression' statement.  
         */
        CTPNStm *ret_stm;
        if (expr->has_return_value())
            ret_stm = new CTPNStmReturn(expr);
        else
            ret_stm = new CTPNStmExpr(expr);

        /* put the 'return' statement inside a compound statement */
        stm = new CTPNStmComp(ret_stm, local_symtab_);
    }
    else
    {
        /*
         *   If we have a propertyset stack, set up an inserted token stream
         *   with the expanded token list for the formals, combining the
         *   formals from the enclosing propertyset definitions with the
         *   formals defined here.  
         */
        if (propset_depth != 0)
            insert_propset_expansion(propset_stack, propset_depth);

        /* 
         *   if we have an explicit left parenthesis, or an implied formal
         *   list from an enclosing propertyset, parse the list 
         */
        if (G_tok->cur() == TOKT_LPAR)
        {
            /* skip the open paren */
            G_tok->next();
            
            /* 
             *   Parse the formal list.  Add the symbols to the local
             *   table (hence 'count_only' = false), and don't allow
             *   optional arguments.  
             */
            parse_formal_list(FALSE, TRUE, &formal_num, &opt_formal_num,
                              &varargs, &varargs_list, &varargs_list_local,
                              err, 0, FALSE, type_list);
            if (*err)
                return 0;
        }

        /* parse an equals sign, if present */
        if (G_tok->cur() == TOKT_EQ)
        {
            /*
             *   An equals sign after a formal parameter list can be used if
             *   the 'eq_before_brace' flag is set.  Otherwise, if we're
             *   defining an object property, this is an error, since it's
             *   obsolete TADS 2 syntax that we no longer allow - because
             *   this is a change in syntax, we want to catch it
             *   specifically so we can provide good diagnostic information
             *   for it.  
             */
            if (eq_before_brace && G_tok->cur() == TOKT_EQ)
            {
                /* it's allowed - skip the '=' */
                G_tok->next();
            }
            else if (is_obj_prop)
            {
                /* obsolete tads 2 syntax - flag the error */
                G_tok->log_error(TCERR_EQ_WITH_METHOD_OBSOLETE);

                /* 
                 *   skip the '=' so we can continue parsing the rest of the
                 *   code body without cascading errors 
                 */
                G_tok->next();
            }
            else
            {
                /* 
                 *   it's not a situation where we allow '=' specifically,
                 *   or where we know why it might be present erroneously -
                 *   let it go for now, as we'll flag the error in the
                 *   normal compound statement parsing 
                 */
            }
        }

        /* check for '(' syntax */
        //$$$

        /* require the '{' */
        switch (G_tok->cur())
        {
        case TOKT_LBRACE:
        parse_body:
            /* note the location of the opening brace */
            G_tok->get_last_pos(&start_desc, &start_line);

            /* parse the compound statement */
            stm = parse_compound(err, TRUE, TRUE, 0, TRUE);
            break;

        case TOKT_SEM:
        case TOKT_RBRACE:
            /* 
             *   we seem to have found the end of the object definition, or
             *   the end of a code body - treat it as an empty code body 
             */
            G_tok->log_error_curtok(TCERR_REQ_LBRACE_CODE);
            stm = new CTPNStmComp(0, 0);
            break;

        default:
            /* 
             *   the '{' was missing - log an error, but proceed from the
             *   current token on the assumption that they merely left out
             *   the open brace 
             */
            G_tok->log_error_curtok(TCERR_REQ_LBRACE_CODE);
            goto parse_body;
        }
    }

    /* if that failed, return the error */
    if (*err || stm == 0)
        return 0;

    /* 
     *   determine how the statement exits, and generate any internal flow
     *   warnings within the body code
     */
    unsigned long flow_flags = stm->get_control_flow(TRUE);

    /*
     *   Warn if the function has both explicit void and value returns.
     *   If not, check to see if it continues; if so, it implicitly
     *   returns a void value by falling off the end, so warn if it both
     *   falls off the end and returns a value somewhere else.  Suppress
     *   this warning if this is a syntax check only.  
     */
    if (!G_prs->get_syntax_only())
    {
        if ((flow_flags & TCPRS_FLOW_RET_VAL) != 0
            && (flow_flags & TCPRS_FLOW_RET_VOID) != 0)
        {
            /* it has explicit void and value returns */
            stm->log_warning(TCERR_RET_VAL_AND_VOID);
        }
        else if ((flow_flags & TCPRS_FLOW_RET_VAL) != 0
                 && (flow_flags & TCPRS_FLOW_NEXT) != 0)
        {
            /* it has explicit value returns, and implicit void return */
            stm->log_warning(TCERR_RET_VAL_AND_IMP_VOID);
        }
    }
        
    /* if the caller is interested, return the interface details */
    if (p_argc != 0)
        *p_argc = formal_num;
    if (p_opt_argc != 0)
        *p_opt_argc = opt_formal_num;
    if (p_varargs != 0)
        *p_varargs = varargs;
    if (p_varargs_list != 0)
        *p_varargs_list = varargs_list;
    if (p_varargs_list_local != 0)
        *p_varargs_list_local = varargs_list_local;
    if (p_has_retval)
        *p_has_retval = ((flow_flags & TCPRS_FLOW_RET_VAL) != 0);

    /* create a code body node for the result */
    CTPNCodeBody *body_stm = new CTPNCodeBody(
        local_symtab_, goto_symtab_, stm,
        formal_num, opt_formal_num, varargs, varargs_list, varargs_list_local,
        max_local_cnt_, self_valid, enclosing_code_body);

    /* store this new statement in the current code body reference object */
    cur_code_body_->ptr = body_stm;

    /* save the starting location */
    body_stm->set_start_location(start_desc, start_line);

    /* 
     *   set the end location in the new code body to the end location in
     *   the underlying compound statement 
     */
    body_stm->set_end_location(stm->get_end_desc(), stm->get_end_linenum());

    /* set up the local context for access to enclosing scope locals */
    finish_local_ctx(body_stm, local_symtab);

    /* 
     *   if 'self' is valid, and we're parsing an anonymous function, and we
     *   have any references in this code body to any method context
     *   variables (self, targetprop, targetobj, definingobj), make certain
     *   that the code body has a context at level 1, so that it can pick up
     *   our method context 
     */
    if (self_valid && parsing_anon_fn
        && (self_referenced_ || full_method_ctx_referenced_))
        body_stm->get_or_add_ctx_var_for_level(1);

    /* mark the code body for references to the method context */
    body_stm->set_self_referenced(self_referenced_);
    body_stm->set_full_method_ctx_referenced(full_method_ctx_referenced_);

    /* 
     *   mark the code body for inclusion in any local context of the method
     *   context 
     */
    body_stm->set_local_ctx_needs_self(local_ctx_needs_self_);
    body_stm->set_local_ctx_needs_full_method_ctx(
        local_ctx_needs_full_method_ctx_);

    /* return the new body statement */
    return body_stm;
}